

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O3

void __thiscall
jaegertracing::Tracer::Tracer
          (Tracer *this,string *serviceName,shared_ptr<jaegertracing::samplers::Sampler> *sampler,
          shared_ptr<jaegertracing::reporters::Reporter> *reporter,
          shared_ptr<jaegertracing::logging::Logger> *logger,
          shared_ptr<jaegertracing::metrics::Metrics> *metrics,
          shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
          *textPropagator,
          shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
          *httpHeaderPropagator,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,int options)

{
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  IPAddress *this_01;
  uint uVar5;
  RestrictionManager *pRVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  value_type *__x;
  undefined1 auVar11 [16];
  random_device device;
  undefined1 *local_1410;
  long local_1408;
  undefined1 local_1400 [16];
  IPAddress *local_13f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e8;
  string *local_13c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_13c0;
  undefined1 local_13b8 [5000];
  
  local_13b8._8_8_ = local_13b8._0_8_;
  (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
  super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_002706e0;
  local_13c0 = &(this->_serviceName).field_2;
  (this->_serviceName)._M_dataplus._M_p = (pointer)local_13c0;
  pcVar1 = (serviceName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_serviceName,pcVar1,pcVar1 + serviceName->_M_string_length);
  local_13f0 = &this->_hostIPv4;
  local_13c8 = &this->_serviceName;
  net::IPAddress::localIP(local_13f0,2);
  (this->_sampler).super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (sampler->
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (sampler->
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_sampler).super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_reporter).
  super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reporter->super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  p_Var2 = (reporter->
           super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_reporter).
  super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_metrics).super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (metrics->super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (metrics->super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_metrics).super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_logger).super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (logger->super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (logger->super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_logger).super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_randomNumberGenerator)._M_x[0] = 0x1571;
  lVar7 = 1;
  uVar10 = 0x1571;
  lVar8 = 0x21;
  do {
    lVar9 = (uVar10 >> 0x3e ^ uVar10) * 0x5851f42d4c957f2d;
    uVar10 = lVar9 + lVar7;
    *(long *)((this->_hostIPv4)._addr.__ss_padding + lVar8 * 8 + -0x3a) = lVar8 + lVar9 + -0x20;
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x158);
  (this->_randomNumberGenerator)._M_p = 0x138;
  *(undefined1 (*) [16])&(this->_randomMutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->_randomMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (this->_randomMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_textPropagator).
  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (textPropagator->
            super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var2 = (textPropagator->
           super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_textPropagator).
  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_httpHeaderPropagator).
  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (httpHeaderPropagator->
            super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var2 = (httpHeaderPropagator->
           super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_httpHeaderPropagator).
  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  propagation::BinaryPropagator::BinaryPropagator(&this->_binaryPropagator,&this->_metrics);
  this_00 = &this->_tags;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar6 = (RestrictionManager *)operator_new(0x10);
  pRVar6->_vptr_RestrictionManager = (_func_int **)&PTR__RestrictionManager_00270e88;
  *(undefined1 *)&pRVar6[1]._vptr_RestrictionManager = 1;
  *(undefined4 *)((long)&pRVar6[1]._vptr_RestrictionManager + 4) = 0x800;
  (this->_restrictionManager)._M_t.
  super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl = pRVar6;
  peVar3 = (this->_metrics).
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->_baggageSetter)._restrictionManager = pRVar6;
  (this->_baggageSetter)._metrics = peVar3;
  this->_options = options;
  local_1410 = local_1400;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"jaeger.version","");
  pcVar1 = local_13b8 + 0x10;
  local_13b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_13b8,local_1410,local_1410 + local_1408)
  ;
  local_13e8._M_dataplus._M_p = "C++-0.9.1";
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<char_const*&,opentracing::v3::util::detail::value_traits<char_const*&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            ((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              *)(local_13b8 + 0x20),(char **)&local_13e8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
  opentracing::v3::util::
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  ::~variant((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              *)(local_13b8 + 0x20));
  if ((pointer)local_13b8._0_8_ != pcVar1) {
    operator_delete((void *)local_13b8._0_8_);
  }
  if (local_1410 != local_1400) {
    operator_delete(local_1410);
  }
  local_1410 = local_1400;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"hostname","");
  platform::hostname_abi_cxx11_();
  local_13b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_13b8,local_1410,local_1410 + local_1408)
  ;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<std::__cxx11::string,opentracing::v3::util::detail::value_traits<std::__cxx11::string,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            ((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              *)(local_13b8 + 0x20),&local_13e8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
  opentracing::v3::util::
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  ::~variant((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              *)(local_13b8 + 0x20));
  if ((pointer)local_13b8._0_8_ != pcVar1) {
    operator_delete((void *)local_13b8._0_8_);
  }
  this_01 = local_13f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
    operator_delete(local_13e8._M_dataplus._M_p);
  }
  if (local_1410 != local_1400) {
    operator_delete(local_1410);
  }
  local_13b8._128_4_ = 0x10;
  local_13b8._0_16_ = (undefined1  [16])0x0;
  local_13b8._16_16_ = (undefined1  [16])0x0;
  local_13b8._32_16_ = (undefined1  [16])0x0;
  local_13b8._48_16_ = (undefined1  [16])0x0;
  local_13b8._64_16_ = (undefined1  [16])0x0;
  local_13b8._80_16_ = (undefined1  [16])0x0;
  local_13b8._96_16_ = (undefined1  [16])0x0;
  local_13b8._112_16_ = (undefined1  [16])0x0;
  if (((this->_hostIPv4)._addrLen == 0x10) &&
     (auVar11[0] = -((char)(this_01->_addr).ss_family == '\0'),
     auVar11[1] = -(*(char *)((long)&(this_01->_addr).ss_family + 1) == '\0'),
     auVar11[2] = -((this_01->_addr).__ss_padding[0] == '\0'),
     auVar11[3] = -((this_01->_addr).__ss_padding[1] == '\0'),
     auVar11[4] = -((this_01->_addr).__ss_padding[2] == '\0'),
     auVar11[5] = -((this_01->_addr).__ss_padding[3] == '\0'),
     auVar11[6] = -((this_01->_addr).__ss_padding[4] == '\0'),
     auVar11[7] = -((this_01->_addr).__ss_padding[5] == '\0'),
     auVar11[8] = -((this_01->_addr).__ss_padding[6] == '\0'),
     auVar11[9] = -((this_01->_addr).__ss_padding[7] == '\0'),
     auVar11[10] = -((this_01->_addr).__ss_padding[8] == '\0'),
     auVar11[0xb] = -((this_01->_addr).__ss_padding[9] == '\0'),
     auVar11[0xc] = -((this_01->_addr).__ss_padding[10] == '\0'),
     auVar11[0xd] = -((this_01->_addr).__ss_padding[0xb] == '\0'),
     auVar11[0xe] = -((this_01->_addr).__ss_padding[0xc] == '\0'),
     auVar11[0xf] = -((this_01->_addr).__ss_padding[0xd] == '\0'),
     (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf)
     == 0xffff)) {
    peVar4 = (this->_logger).
             super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_13b8._8_8_ = 0;
    local_13b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13b8,"Unable to determine this host\'s IP address","");
    (*peVar4->_vptr_Logger[2])(peVar4,local_13b8);
    if ((pointer)local_13b8._0_8_ != pcVar1) {
      operator_delete((void *)local_13b8._0_8_);
    }
  }
  else {
    local_1410 = local_1400;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"ip","");
    net::IPAddress::host_abi_cxx11_(&local_13e8,this_01);
    local_13b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_13b8,local_1410,local_1410 + local_1408);
    opentracing::v3::util::
    variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
    ::
    variant<std::__cxx11::string,opentracing::v3::util::detail::value_traits<std::__cxx11::string,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
              ((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)(local_13b8 + 0x20),&local_13e8);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
    emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
    opentracing::v3::util::
    variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
    ::~variant((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)(local_13b8 + 0x20));
    if ((pointer)local_13b8._0_8_ != pcVar1) {
      operator_delete((void *)local_13b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
      operator_delete(local_13e8._M_dataplus._M_p);
    }
    if (local_1410 != local_1400) {
      operator_delete(local_1410);
    }
  }
  __x = (tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar10 = (long)(tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__x;
  if (0 < (long)uVar10) {
    uVar10 = uVar10 / 0x48 + 1;
    do {
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back(this_00,__x);
      __x = __x + 1;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  std::random_device::random_device((random_device *)local_13b8);
  uVar5 = std::random_device::_M_getval();
  uVar10 = (ulong)uVar5;
  (this->_randomNumberGenerator)._M_x[0] = uVar10;
  lVar7 = 1;
  lVar8 = 0x21;
  do {
    lVar9 = (uVar10 >> 0x3e ^ uVar10) * 0x5851f42d4c957f2d;
    uVar10 = lVar9 + lVar7;
    *(long *)((this->_hostIPv4)._addr.__ss_padding + lVar8 * 8 + -0x3a) = lVar8 + lVar9 + -0x20;
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x158);
  (this->_randomNumberGenerator)._M_p = 0x138;
  std::random_device::_M_fini();
  return;
}

Assistant:

Tracer(const std::string& serviceName,
           const std::shared_ptr<samplers::Sampler>& sampler,
           const std::shared_ptr<reporters::Reporter>& reporter,
           const std::shared_ptr<logging::Logger>& logger,
           const std::shared_ptr<metrics::Metrics>& metrics,
           const std::shared_ptr<TextMapPropagator> &textPropagator,
           const std::shared_ptr<HTTPHeaderPropagator> &httpHeaderPropagator,
           const std::vector<Tag>& tags,
           int options)
        : _serviceName(serviceName)
        , _hostIPv4(net::IPAddress::localIP(AF_INET))
        , _sampler(sampler)
        , _reporter(reporter)
        , _metrics(metrics)
        , _logger(logger)
        , _randomNumberGenerator()
        , _textPropagator(textPropagator)
        , _httpHeaderPropagator(httpHeaderPropagator)
        , _binaryPropagator(_metrics)
        , _tags()
        , _restrictionManager(new baggage::DefaultRestrictionManager(0))
        , _baggageSetter(*_restrictionManager, *_metrics)
        , _options(options)
    {
        _tags.push_back(Tag(kJaegerClientVersionTagKey, kJaegerClientVersion));

        try {
            _tags.push_back(Tag(kTracerHostnameTagKey, platform::hostname()));
        } catch (const std::system_error&) {
            // Ignore hostname error.
        }

        if (_hostIPv4 == net::IPAddress()) {
            _logger->error("Unable to determine this host's IP address");
        }
        else {
            _tags.push_back(Tag(kTracerIPTagKey, _hostIPv4.host()));
        }

        std::copy(tags.cbegin(), tags.cend(), std::back_inserter(_tags));

        std::random_device device;
        _randomNumberGenerator.seed(device());
    }